

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void replace_helper(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,qsizetype blen
                   ,QStringView after)

{
  long lVar1;
  long lVar2;
  QStringView after_00;
  QSpan<unsigned_long,_18446744073709551615UL> indices_00;
  bool bVar3;
  DataPointer *pDVar4;
  QChar *pQVar5;
  qsizetype qVar6;
  QVarLengthArray<QChar,_256LL> *this;
  QVarLengthArray<QChar,_256LL> *this_00;
  QStringView *this_01;
  QChar *in_RCX;
  QString *in_RDX;
  unsigned_long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype newSize;
  qsizetype adjust;
  qsizetype oldSize;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffcf0;
  qsizetype in_stack_fffffffffffffcf8;
  QString *in_stack_fffffffffffffd00;
  QString *in_stack_fffffffffffffd08;
  QChar **in_stack_fffffffffffffd10;
  qsizetype in_stack_fffffffffffffd58;
  QString *in_stack_fffffffffffffd60;
  QChar local_288 [4];
  storage_type_conflict *in_stack_fffffffffffffd80;
  qsizetype in_stack_fffffffffffffd88;
  unsigned_long *in_stack_fffffffffffffd90;
  qsizetype in_stack_fffffffffffffd98;
  QStringView local_240;
  QStringView in_stack_fffffffffffffe00;
  QSpanBase<unsigned_long,_18446744073709551615UL> in_stack_fffffffffffffe10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = QString::data_ptr(in_RDI);
  lVar2 = pDVar4->size;
  pQVar5 = (QChar *)QSpan<unsigned_long,_18446744073709551615UL>::size
                              ((QSpan<unsigned_long,_18446744073709551615UL> *)
                               &stack0xfffffffffffffdd0);
  qVar6 = QStringView::size(&local_240);
  this = (QVarLengthArray<QChar,_256LL> *)(lVar2 + (long)pQVar5 * (qVar6 - (long)in_RCX));
  QString::data_ptr(in_RDI);
  bVar3 = QArrayDataPointer<char16_t>::needsDetach(in_stack_fffffffffffffcf0);
  if (!bVar3) {
    bVar3 = needsReallocate(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    if (!bVar3) {
      QStringView::begin((QStringView *)0x1d58d5);
      bVar3 = QtPrivate::q_points_into_range<QString,QChar_const*>
                        (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      if (bVar3) {
        this_00 = (QVarLengthArray<QChar,_256LL> *)QStringView::begin((QStringView *)0x1d5939);
        QStringView::end((QStringView *)this_00);
        QVarLengthArray<QChar,_256LL>::QVarLengthArray<const_QChar_*,_true>(this,pQVar5,in_RCX);
        pQVar5 = local_288;
        this_01 = (QStringView *)
                  std::data<QVarLengthArray<QChar,256ll>>((QVarLengthArray<QChar,_256LL> *)0x1d598e)
        ;
        QtPrivate::lengthHelperContainer<QVarLengthArray<QChar,256ll>>
                  ((QVarLengthArray<QChar,_256LL> *)0x1d599d);
        QStringView::QStringView<QChar,_true>(this_01,pQVar5,(qsizetype)this_00);
        replace_in_place(in_RDX,(QSpan<unsigned_long,_18446744073709551615UL>)
                                in_stack_fffffffffffffe10,(qsizetype)in_RSI,
                         in_stack_fffffffffffffe00);
        QVarLengthArray<QChar,_256LL>::~QVarLengthArray(this_00);
      }
      else {
        replace_in_place(in_RDX,(QSpan<unsigned_long,_18446744073709551615UL>)
                                in_stack_fffffffffffffe10,(qsizetype)in_RSI,
                         in_stack_fffffffffffffe00);
      }
      goto LAB_001d5a50;
    }
  }
  indices_00.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size =
       in_stack_fffffffffffffd98;
  indices_00.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data =
       in_stack_fffffffffffffd90;
  after_00.m_size = in_stack_fffffffffffffd88;
  after_00.m_data = in_stack_fffffffffffffd80;
  replace_with_copy(in_stack_fffffffffffffd60,indices_00,in_stack_fffffffffffffd58,after_00);
LAB_001d5a50:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void replace_helper(QString &str, QSpan<size_t> indices, qsizetype blen, QStringView after)
{
    const qsizetype oldSize = str.data_ptr().size;
    const qsizetype adjust = indices.size() * (after.size() - blen);
    const qsizetype newSize = oldSize + adjust;
    if (str.data_ptr().needsDetach() || needsReallocate(str, newSize)) {
        replace_with_copy(str, indices, blen, after);
        return;
    }

    if (QtPrivate::q_points_into_range(after.begin(), str))
        // Copy after if it lies inside our own d.b area (which we could
        // possibly invalidate via a realloc or modify by replacement)
        replace_in_place(str, indices, blen, QVarLengthArray(after.begin(), after.end()));
    else
        replace_in_place(str, indices, blen, after);
}